

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

void lj_tab_resize(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  ulong uVar7;
  uint uVar8;
  TValue *oarray;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar11 = (ulong)asize;
  uVar7 = (ulong)(t->node).ptr32;
  uVar8 = t->asize;
  uVar12 = (ulong)uVar8;
  uVar1 = t->hmask;
  if (uVar8 < asize) {
    if (0x8000001 < asize) goto LAB_0011c566;
    pvVar3 = (void *)(ulong)(t->array).ptr32;
    if (t->colo < '\x01') {
      pvVar2 = lj_mem_realloc(L,pvVar3,uVar8 * 8,asize * 8);
    }
    else {
      pvVar2 = lj_mem_realloc(L,(void *)0x0,0,asize * 8);
      t->colo = t->colo | 0x80;
      if (uVar12 != 0) {
        uVar9 = 0;
        do {
          *(undefined8 *)((long)pvVar2 + uVar9 * 8) = *(undefined8 *)((long)pvVar3 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
      }
    }
    (t->array).ptr32 = (uint32_t)pvVar2;
    t->asize = asize;
    if (uVar8 < asize) {
      uVar9 = uVar12;
      do {
        *(undefined4 *)((long)pvVar2 + uVar9 * 8 + 4) = 0xffffffff;
        uVar9 = uVar9 + 1;
      } while (asize != uVar9);
    }
  }
  if (hbits == 0) {
    (t->node).ptr32 = (L->glref).ptr32 + 0x130;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
LAB_0011c566:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar10 = 1 << ((byte)hbits & 0x1f);
    uVar9 = (ulong)uVar10;
    pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(GCSize)(0x18L << ((byte)hbits & 0x3f)));
    (t->node).ptr32 = (uint32_t)pvVar3;
    *(uint32_t *)((long)pvVar3 + 0x14) = (uint32_t)pvVar3 + uVar10 * 0x18;
    t->hmask = uVar10 - 1;
    lVar4 = ((ulong)pvVar3 & 0xffffffff) + 0x10;
    do {
      *(undefined8 *)(lVar4 + -4) = 0xffffffff;
      *(undefined4 *)(lVar4 + -0xc) = 0xffffffff;
      lVar4 = lVar4 + 0x18;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (asize < uVar8) {
    pvVar3 = (void *)(ulong)(t->array).ptr32;
    t->asize = asize;
    do {
      if (*(int *)((long)pvVar3 + uVar11 * 8 + 4) != -1) {
        pTVar5 = lj_tab_setinth(L,t,(int32_t)uVar11);
        *pTVar5 = *(TValue *)((long)pvVar3 + uVar11 * 8);
      }
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    if (t->colo < '\x01') {
      pvVar3 = lj_mem_realloc(L,pvVar3,uVar8 << 3,asize << 3);
      (t->array).ptr32 = (uint32_t)pvVar3;
    }
  }
  if (uVar1 == 0) {
    return;
  }
  uVar11 = 0;
  do {
    if (*(int *)(uVar7 + 4 + uVar11 * 0x18) != -1) {
      pTVar5 = (TValue *)(uVar7 + uVar11 * 0x18);
      pTVar6 = lj_tab_set(L,t,pTVar5 + 1);
      *pTVar6 = *pTVar5;
    }
    uVar8 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar8;
  } while (uVar8 <= uVar1);
  uVar11 = (ulong)(L->glref).ptr32;
  lVar4 = (ulong)(uVar1 + 1) * 0x18;
  *(int *)(uVar11 + 0x50) = *(int *)(uVar11 + 0x50) - (int)lVar4;
  *(long *)(uVar11 + 0x90) = *(long *)(uVar11 + 0x90) + lVar4;
  (**(code **)(uVar11 + 0x40))
            (*(undefined8 *)(uVar11 + 0x48),uVar7,lVar4,0,*(code **)(uVar11 + 0x40));
  return;
}

Assistant:

void lj_tab_resize(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
#if LJ_GC64
    setmref(t->freetop, &g->nilnode);
#endif
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}